

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fill.hpp
# Opt level: O3

map<int,_njoy::ENDFtk::section::Type<3>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<3>_>_>_>
* njoy::ENDFtk::file::Base<njoy::ENDFtk::file::Type<3>,_njoy::ENDFtk::section::Type<3>_>::fill
            (map<int,_njoy::ENDFtk::section::Type<3>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<3>_>_>_>
             *__return_storage_ptr__,
            vector<njoy::ENDFtk::section::Type<3>,_std::allocator<njoy::ENDFtk::section::Type<3>_>_>
            *sections)

{
  _Rb_tree_header *p_Var1;
  pointer pTVar2;
  _Rb_tree_impl<std::less<int>,_true> *p_Var3;
  _Base_ptr p_Var4;
  undefined8 *puVar5;
  _Rb_tree_color _Var6;
  _Base_ptr p_Var7;
  pointer __args_1;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_njoy::ENDFtk::section::Type<3>_>_>,_bool> pVar8;
  int MT;
  map<int,_njoy::ENDFtk::section::Type<3>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<3>_>_>_>
  map;
  int local_64;
  _Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<3>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<3>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<3>_>_>_>
  local_60;
  
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  __args_1 = (sections->
             super__Vector_base<njoy::ENDFtk::section::Type<3>,_std::allocator<njoy::ENDFtk::section::Type<3>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  pTVar2 = (sections->
           super__Vector_base<njoy::ENDFtk::section::Type<3>,_std::allocator<njoy::ENDFtk::section::Type<3>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (__args_1 != pTVar2) {
    do {
      local_64 = (__args_1->super_Base).MT_;
      pVar8 = std::
              _Rb_tree<int,std::pair<int_const,njoy::ENDFtk::section::Type<3>>,std::_Select1st<std::pair<int_const,njoy::ENDFtk::section::Type<3>>>,std::less<int>,std::allocator<std::pair<int_const,njoy::ENDFtk::section::Type<3>>>>
              ::_M_emplace_unique<int&,njoy::ENDFtk::section::Type<3>>
                        ((_Rb_tree<int,std::pair<int_const,njoy::ENDFtk::section::Type<3>>,std::_Select1st<std::pair<int_const,njoy::ENDFtk::section::Type<3>>>,std::less<int>,std::allocator<std::pair<int_const,njoy::ENDFtk::section::Type<3>>>>
                          *)&local_60,&local_64,__args_1);
      if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        tools::Log::error<char_const*>("Section with duplicate section number found");
        tools::Log::info<char_const*>
                  ("Sections are required to specify a unique MT or section number");
        tools::Log::info<char_const*,int>("Encountered duplicate MT: {}",local_64);
        puVar5 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar5 = getenv;
        __cxa_throw(puVar5,&std::exception::typeinfo,std::exception::~exception);
      }
      __args_1 = __args_1 + 1;
    } while (__args_1 != pTVar2);
    if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
           local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
      (local_60._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count =
           local_60._M_impl.super__Rb_tree_header._M_node_count;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      p_Var3 = &local_60._M_impl;
      p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_right;
      _Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_color;
      local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      goto LAB_00149e9f;
    }
  }
  p_Var4 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var3 = &(__return_storage_ptr__->_M_t)._M_impl;
  _Var6 = _S_red;
  p_Var7 = p_Var4;
LAB_00149e9f:
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = p_Var4;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = p_Var7;
  (p_Var3->super__Rb_tree_header)._M_node_count = 0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _Var6;
  std::
  _Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<3>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<3>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<3>_>_>_>
  ::~_Rb_tree(&local_60);
  return __return_storage_ptr__;
}

Assistant:

static auto
fill( std::vector< Section >&& sections ) {

  std::map< int, Section > map;
  for ( auto&& section : sections ) {

    int MT = Derived::getSectionNumber( section );
    if ( not map.emplace( MT, std::move( section ) ).second ) {

      Log::error( "Section with duplicate section number found" );
      Log::info( "Sections are required to specify a unique MT or section number" );
      Log::info( "Encountered duplicate MT: {}", MT );
      throw std::exception();
    }
  }
  return map;
}